

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

int aa64_va_parameter_tbid(uint64_t tcr,ARMMMUIdx mmu_idx)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint64_t uVar3;
  ARMMMUIdx mmu_idx_local;
  uint64_t tcr_local;
  
  _Var1 = regime_has_2_ranges(mmu_idx);
  if (_Var1) {
    uVar3 = extract64(tcr,0x33,2);
    tcr_local._4_4_ = (int)uVar3;
  }
  else if (mmu_idx == ARMMMUIdx_Stage2) {
    tcr_local._4_4_ = 0;
  }
  else {
    uVar2 = extract32((uint32_t)tcr,0x1d,1);
    tcr_local._4_4_ = uVar2 * 3;
  }
  return tcr_local._4_4_;
}

Assistant:

static int aa64_va_parameter_tbid(uint64_t tcr, ARMMMUIdx mmu_idx)
{
    if (regime_has_2_ranges(mmu_idx)) {
        return extract64(tcr, 51, 2);
    } else if (mmu_idx == ARMMMUIdx_Stage2) {
        return 0; /* VTCR_EL2 */
    } else {
        /* Replicate the single TBID bit so we always have 2 bits.  */
        return extract32(tcr, 29, 1) * 3;
    }
}